

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  u8 uVar1;
  sqlite3 *db;
  IdList_item *pIVar2;
  Select *pSVar3;
  Expr *pEVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (pList == (ExprList *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)pList->nExpr;
  }
  db = pParse->db;
  if (pExpr == (Expr *)0x0 || pColumns == (IdList *)0x0) {
LAB_00153529:
    if (pExpr == (Expr *)0x0) goto LAB_0015354c;
  }
  else {
    uVar1 = pExpr->op;
    iVar6 = pColumns->nId;
    if (uVar1 == 'w') {
LAB_001534b5:
      if (0 < iVar6) {
        lVar9 = 0;
        lVar7 = 0;
        do {
          pEVar4 = sqlite3ExprForVectorField(pParse,pExpr,(int)lVar7);
          pList = sqlite3ExprListAppend((Parse *)pParse->db,pList,pEVar4);
          if (pList != (ExprList *)0x0) {
            pIVar2 = pColumns->a;
            pList->a[(long)pList->nExpr + -1].zName = *(char **)((long)&pIVar2->zName + lVar9);
            *(undefined8 *)((long)&pIVar2->zName + lVar9) = 0;
          }
          lVar7 = lVar7 + 1;
          iVar6 = pColumns->nId;
          lVar9 = lVar9 + 0x10;
        } while (lVar7 < iVar6);
      }
      if (db->mallocFailed != '\0') goto LAB_00153529;
      if ((pList != (ExprList *)0x0) && (pExpr->op == 'w')) {
        pEVar4 = pList->a[lVar8].pExpr;
        pEVar4->pRight = pExpr;
        pEVar4->iTable = iVar6;
        goto LAB_0015354c;
      }
    }
    else {
      if (uVar1 == 0x9d) {
        uVar1 = pExpr->op2;
      }
      if (uVar1 == 'w') {
        pSVar3 = (pExpr->x).pSelect;
LAB_001534ac:
        iVar5 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr;
      }
      else {
        iVar5 = 1;
        if (uVar1 == 0x9e) {
          pSVar3 = (Select *)&pExpr->x;
          goto LAB_001534ac;
        }
      }
      if (iVar6 == iVar5) goto LAB_001534b5;
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values");
    }
  }
  sqlite3ExprDeleteNN(db,pExpr);
LAB_0015354c:
  sqlite3IdListDelete(db,pColumns);
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that 
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT, 
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i);
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );
     
    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprDelete(db, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}